

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test_simple_ggx_fit(void)

{
  vec3 view_dir_00;
  ostream *poVar1;
  reference pvVar2;
  void *pvVar3;
  vec<3,_float,_(glm::precision)0> *x;
  vec<3,_float,_(glm::precision)0> vVar4;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  brdf_plot plot;
  ltc ltc;
  undefined1 local_cc [8];
  ltc_store_data data;
  vec3 next_guess;
  vec3 first_guess;
  ltc_average_terms local_74;
  undefined8 local_60;
  vec3 average_direction;
  vec<3,_float,_(glm::precision)0> local_3c;
  undefined1 local_30 [8];
  vec<3,_float,_(glm::precision)0> view_dir;
  undefined1 local_18 [8];
  ggx ggx;
  
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_simple_ggx_fit started.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ::ggx::ggx((ggx *)local_18);
  ::ggx::set_alpha((ggx *)local_18,0.15);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_3c,0.0,0.0,1.0);
  vVar4 = glm::normalize<3,float,(glm::precision)0,glm::vec>(&local_3c);
  view_dir.field_0.field_0.x = (float)vVar4.field_0._8_4_;
  unique0x100002b2 = vVar4.field_0._0_8_;
  local_30 = (undefined1  [8])unique0x100002b2;
  calculate_average_terms(&local_74,(brdf *)local_18,(vec3 *)local_30,0x20);
  average_direction.field_0.field_0.x = local_74.average_direction.field_0.field_0.z;
  local_60 = local_74.average_direction.field_0._0_8_;
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," average direction: ");
  glm::to_string<glm::vec<3,float,(glm::precision)0>>
            ((string *)((long)&first_guess.field_0 + 4),(glm *)&local_60,x);
  poVar1 = std::operator<<(poVar1,(string *)((long)&first_guess.field_0 + 4));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)((long)&first_guess.field_0 + 4));
  glm::vec<3,_float,_(glm::precision)0>::vec
            ((vec<3,_float,_(glm::precision)0> *)((long)&next_guess.field_0 + 4),1.0,1.0,0.0);
  glm::vec<3,_float,_(glm::precision)0>::vec
            ((vec<3,_float,_(glm::precision)0> *)&data.distribution_norm);
  view_dir_00.field_0.field_0.z = view_dir.field_0.field_0.x;
  view_dir_00.field_0._0_8_ = local_30;
  ltc_fit((ltc_store_data *)local_cc,(brdf *)local_18,view_dir_00,true,
          (vec3 *)((long)&next_guess.field_0 + 4),(vec3 *)&data.distribution_norm);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"Store data:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," a=");
  pvVar2 = std::array<float,_5UL>::operator[]((array<float,_5UL> *)local_cc,0);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," b=");
  pvVar2 = std::array<float,_5UL>::operator[]((array<float,_5UL> *)local_cc,1);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," c=");
  pvVar2 = std::array<float,_5UL>::operator[]((array<float,_5UL> *)local_cc,2);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," d=");
  pvVar2 = std::array<float,_5UL>::operator[]((array<float,_5UL> *)local_cc,3);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," e=");
  pvVar2 = std::array<float,_5UL>::operator[]((array<float,_5UL> *)local_cc,4);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," fresnel=");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[4]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," magnitude=");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[3]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  ::ltc::ltc((ltc *)((long)&plot._view_matrix_inv.value[3].field_0 + 8));
  ::ltc::set_store_data
            ((ltc *)((long)&plot._view_matrix_inv.value[3].field_0 + 8),(ltc_store_data *)local_cc);
  brdf_plot::brdf_plot((brdf_plot *)local_1f0);
  brdf_plot::set_view_dir((brdf_plot *)local_1f0,(vec3 *)local_30);
  brdf_plot::set_resolution((brdf_plot *)local_1f0,0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"test_simple_ggx_fit_ggx.png",&local_211);
  brdf_plot::export_png((brdf_plot *)local_1f0,(brdf *)local_18,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"test_simple_ggx_fit_ltc.png",&local_239);
  brdf_plot::export_png
            ((brdf_plot *)local_1f0,(brdf *)((long)&plot._view_matrix_inv.value[3].field_0 + 8),
             &local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_simple_ggx_fit completed.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  brdf_plot::~brdf_plot((brdf_plot *)local_1f0);
  ::ltc::~ltc((ltc *)((long)&plot._view_matrix_inv.value[3].field_0 + 8));
  ::ggx::~ggx((ggx *)local_18);
  return;
}

Assistant:

void test_simple_ggx_fit()
{
    log_info() << "VISUAL TEST: test_simple_ggx_fit started." << std::endl;

    ggx ggx;
    ggx.set_alpha(0.15f);

    auto view_dir = glm::normalize(glm::vec3{0.0f, 0.0f, 1.0f});

    auto average_direction = calculate_average_terms(ggx, view_dir).average_direction;
    log_info() << " average direction: " << glm::to_string(average_direction) << std::endl;

    glm::vec3 first_guess = glm::vec3{1.0f, 1.0f, 0.0f};
    glm::vec3 next_guess;
    auto data = ltc_fit(ggx, view_dir, true, first_guess, next_guess);

    log_info() << "Store data:" << std::endl;
    log_info() << " a=" << data.matrix_parameters[0] << std::endl;
    log_info() << " b=" << data.matrix_parameters[1] << std::endl;
    log_info() << " c=" << data.matrix_parameters[2] << std::endl;
    log_info() << " d=" << data.matrix_parameters[3] << std::endl;
    log_info() << " e=" << data.matrix_parameters[4] << std::endl;
    log_info() << " fresnel=" << data.fresnel_term << std::endl;
    log_info() << " magnitude=" << data.distribution_norm << std::endl;

    ltc ltc;
    ltc.set_store_data(data);

    brdf_plot plot;
    plot.set_view_dir(view_dir);
    plot.set_resolution(512);
    plot.export_png(&ggx, "test_simple_ggx_fit_ggx.png");
    plot.export_png(&ltc, "test_simple_ggx_fit_ltc.png");

    log_info() << "VISUAL TEST: test_simple_ggx_fit completed." << std::endl;
}